

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O2

void __thiscall
PngInput::readImage(PngInput *this,void *bufferOut,size_t bufferOutByteCount,uint32_t param_3,
                   uint32_t param_4,FormatDescriptor *format)

{
  ushort *puVar1;
  uint w;
  uint h;
  FormatDescriptor *pFVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  size_t i;
  ulong uVar6;
  runtime_error *prVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  idat_in;
  uint32_t c;
  FormatDescriptor *this_00;
  ulong uVar11;
  uint uVar12;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string local_a8;
  string local_88;
  char *local_68;
  char *local_58;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_48;
  
  pFVar2 = *(FormatDescriptor **)&(this->super_ImageInput).images;
  this_00 = format;
  if ((format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_00 = pFVar2;
  }
  uVar12 = (this_00->extended).channelCount;
  w = *(uint *)&pFVar2[1].basic;
  h = *(uint *)&pFVar2[1].basic.field_0x4;
  uVar3 = FormatDescriptor::largestChannelBitLength(this_00);
  uVar4 = imageio::bit_ceil<unsigned_int>(uVar3);
  uVar5 = 8;
  if (8 < uVar4) {
    uVar5 = uVar4;
  }
  if ((uVar5 != 8) && (uVar5 != 0x10)) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = (pointer)(ulong)uVar5;
    fmt_02.size_ = 2;
    fmt_02.data_ = (char *)0x47;
    args_02.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)format;
    args_02.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,
               (v10 *)"PNG decode error: Requested decode into {}-bit format is not supported.",
               fmt_02,args_02);
    std::runtime_error::runtime_error(prVar7,(string *)&local_88);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = *(ulong *)(this_00->samples).
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar6 & 0xf0000000) != 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar12 = (uint)uVar6;
    local_88.field_2._M_allocated_capacity = (size_type)" Linear";
    if ((uVar12 >> 0x1c & 1) == 0) {
      local_88.field_2._M_allocated_capacity = (size_type)"";
    }
    local_68 = " Exponent";
    if ((uVar12 >> 0x1d & 1) == 0) {
      local_68 = "";
    }
    local_58 = " Signed";
    if ((uVar12 >> 0x1e & 1) == 0) {
      local_58 = "";
    }
    local_88._M_dataplus._M_p = (pointer)(ulong)uVar5;
    local_48.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x177700;
    if (-1 < (int)uVar12) {
      local_48.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x1784a0;
    }
    fmt.size_ = 0xcccc2;
    fmt.data_ = (char *)0x51;
    args.field_1.values_ = local_48.values_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,
               (v10 *)
               "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.",
               fmt,args);
    std::runtime_error::runtime_error(prVar7,(string *)&local_a8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->state).super_LodePNGState.info_raw.bitdepth = uVar5;
  uVar5 = (this_00->extended).channelCount - 1;
  if (uVar5 < 4) {
    (this->state).super_LodePNGState.info_raw.colortype =
         *(LodePNGColorType *)(&DAT_0017af90 + (ulong)uVar5 * 4);
    idat_in = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
               )this->pIdat;
    uVar5 = lodepng_finish_decode
                      ((uchar *)bufferOut,bufferOutByteCount,w,h,&(this->state).super_LodePNGState,
                       idat_in.values_,this->idatsize);
    if (uVar5 == 0) {
      if (uVar4 == 0x10) {
        for (uVar6 = 0; uVar6 < bufferOutByteCount; uVar6 = uVar6 + 2) {
          puVar1 = (ushort *)((long)bufferOut + uVar6);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        }
      }
      if ((this->state).super_LodePNGState.info_png.sbit_defined != 0) {
        local_88._M_dataplus._M_p = *(pointer *)&(this->state).super_LodePNGState.info_png.sbit_r;
        local_88._M_string_length._0_4_ = (this->state).super_LodePNGState.info_png.sbit_b;
        local_88._M_string_length._4_4_ = (this->state).super_LodePNGState.info_png.sbit_a;
        lVar10 = 0;
        for (uVar5 = 0; uVar5 != h; uVar5 = uVar5 + 1) {
          lVar9 = lVar10;
          for (uVar8 = 0; uVar8 != w; uVar8 = uVar8 + 1) {
            for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
              uVar11 = (ulong)(uint)((int)uVar6 + (int)lVar9);
              uVar3 = *(uint32_t *)((long)&local_88._M_dataplus._M_p + uVar6 * 4);
              if (uVar4 < 9) {
                uVar3 = imageio::convertUNORM
                                  ((uint)(*(byte *)((long)bufferOut + uVar11) >>
                                         (8U - (char)uVar3 & 0x1f)),uVar3,8);
                *(char *)((long)bufferOut + uVar11) = (char)uVar3;
              }
              else {
                uVar3 = imageio::convertUNORM
                                  ((uint)(*(ushort *)((long)bufferOut + uVar11 * 2) >>
                                         (0x10U - (char)uVar3 & 0x1f)),uVar3,0x10);
                *(short *)((long)bufferOut + uVar11 * 2) = (short)uVar3;
              }
            }
            lVar9 = lVar9 + (ulong)uVar12;
          }
          lVar10 = lVar10 + (ulong)(w * uVar12);
        }
      }
      return;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = lodepng_error_text(uVar5);
    fmt_01.size_ = 0xc;
    fmt_01.data_ = (char *)0x15;
    args_01.field_1.values_ = idat_in.values_;
    args_01.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"PNG decode error: {}.",fmt_01,args_01);
    std::runtime_error::runtime_error(prVar7,(string *)&local_88);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)(ulong)(this_00->extended).channelCount;
  fmt_00.size_ = 2;
  fmt_00.data_ = (char *)0x45;
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)format;
  args_00.desc_ = (unsigned_long_long)&local_a8;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_88,
             (v10 *)"PNG decode error: Requested decode into {} channels is not supported.",fmt_00,
             args_00);
  std::runtime_error::runtime_error(prVar7,(string *)&local_88);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
PngInput::readImage(void* bufferOut, size_t bufferOutByteCount,
                    uint32_t /*subimage*/, uint32_t /*miplevel*/,
                    const FormatDescriptor& format)
{
    const auto& targetFormat = format.isUnknown() ? spec().format() : format;

    const auto channelCount = targetFormat.channelCount();
    const auto height = spec().height();
    const auto width = spec().width();
    const auto targetBitLength = targetFormat.largestChannelBitLength();
    const auto requestBits = std::max(imageio::bit_ceil(targetBitLength), 8u);

    if (requestBits != 8 && requestBits != 16)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {}-bit format is not supported.",
                requestBits)
              );

    const bool targetL = targetFormat.samples[0].qualifierLinear;
    const bool targetE = targetFormat.samples[0].qualifierExponent;
    const bool targetS = targetFormat.samples[0].qualifierSigned;
    const bool targetF = targetFormat.samples[0].qualifierFloat;

    // Only UNORM requests are allowed for PNG inputs
    if (targetE || targetL || targetS || targetF)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.",
                requestBits,
                targetL ? " Linear" : "",
                targetE ? " Exponent" : "",
                targetS ? " Signed" : "",
                targetF ? " Float" : "")
              );

    state.info_raw.bitdepth = requestBits;
    state.info_raw.colortype = [&]{
        switch (targetFormat.channelCount()) {
        case 1:
            return LCT_GREY;
        case 2:
            return LCT_GREY_ALPHA;
        case 3:
            return LCT_RGB;
        case 4:
            return LCT_RGBA;
        }
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {} channels is not supported.",
                targetFormat.channelCount())
              );
    }();
    auto lodepngError = lodepng_finish_decode(
                                          (unsigned char*)bufferOut,
                                          bufferOutByteCount,
                                          width,
                                          height,
                                          &state,
                                          pIdat,
                                          idatsize);

    if (lodepngError)
        throw std::runtime_error(fmt::format(
                "PNG decode error: {}.", lodepng_error_text(lodepngError)));

    // TODO: Detect endianness
    // if constexpr (std::endian::native == std::endian::little)
    if (requestBits == 16) {
        // LodePNG loads 16 bit channels in big endian order
        auto* data = (unsigned char*) bufferOut;
        for (size_t i = 0; i < bufferOutByteCount; i += 2)
            std::swap(*(data + i), *(data + i + 1));
    }

    if (state.info_png.sbit_defined) {
        // Recalculate the UNORM values based on sBit information to ensure best loading/rounding
        // result regardless of what the png file's writer saved
        std::array<uint32_t, 4> sBits{
            state.info_png.sbit_r,
            state.info_png.sbit_g,
            state.info_png.sbit_b,
            state.info_png.sbit_a,
        };

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < channelCount; ++c) {
                    const auto index = y * width * channelCount + x * channelCount + c;
                    if (requestBits == 8) {
                        auto& value = *(reinterpret_cast<uint8_t*>(bufferOut) + index);
                        value = static_cast<uint8_t>(imageio::convertUNORM(value >> (8 - sBits[c]), sBits[c], 8));
                    } else { // requestBits == 16
                        auto& value = *(reinterpret_cast<uint16_t*>(bufferOut) + index);
                        value = static_cast<uint16_t>(imageio::convertUNORM(value >> (16 - sBits[c]), sBits[c], 16));
                    }
                }
            }
        }
    }
}